

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O0

void uhttp_client_dowork(HTTP_CLIENT_HANDLE handle)

{
  HTTP_CLIENT_REQUEST_TYPE request_type;
  int iVar1;
  LIST_ITEM_HANDLE item_handle;
  HTTP_CLIENT_REQUEST_TYPE *__ptr;
  size_t length;
  char *relative_path;
  LOGGER_LOG p_Var2;
  uchar *data_line;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t content_len;
  HTTP_SEND_DATA *send_data;
  LIST_ITEM_HANDLE pending_list_item;
  HTTP_CLIENT_HANDLE_DATA *http_data;
  HTTP_CLIENT_HANDLE handle_local;
  
  if ((handle != (HTTP_CLIENT_HANDLE)0x0) &&
     (xio_dowork(handle->xio_handle), handle->connected == 1)) {
    while (item_handle = singlylinkedlist_get_head_item(handle->data_list),
          item_handle != (LIST_ITEM_HANDLE)0x0) {
      __ptr = (HTTP_CLIENT_REQUEST_TYPE *)singlylinkedlist_item_get_value(item_handle);
      if (__ptr != (HTTP_CLIENT_REQUEST_TYPE *)0x0) {
        length = BUFFER_length(*(BUFFER_HANDLE *)(__ptr + 6));
        request_type = *__ptr;
        relative_path = STRING_c_str(*(STRING_HANDLE *)(__ptr + 2));
        iVar1 = send_http_data(handle,request_type,relative_path,*(STRING_HANDLE *)(__ptr + 4));
        if (iVar1 == 0) {
          if (length != 0) {
            data_line = BUFFER_u_char(*(BUFFER_HANDLE *)(__ptr + 6));
            iVar1 = write_data_line(handle,data_line,length);
            if (iVar1 != 0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"uhttp_client_dowork",0x5b1,1,"Failure writing content buffer");
              }
              if (handle->on_error != (ON_HTTP_ERROR_CALLBACK)0x0) {
                (*handle->on_error)(handle->error_user_ctx,HTTP_CALLBACK_REASON_SEND_FAILED);
              }
            }
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"uhttp_client_dowork",0x5a6,1,"Failure writing content buffer");
          }
          if (handle->on_error != (ON_HTTP_ERROR_CALLBACK)0x0) {
            (*handle->on_error)(handle->error_user_ctx,HTTP_CALLBACK_REASON_SEND_FAILED);
          }
        }
        STRING_delete(*(STRING_HANDLE *)(__ptr + 2));
        BUFFER_delete(*(BUFFER_HANDLE *)(__ptr + 6));
        STRING_delete(*(STRING_HANDLE *)(__ptr + 4));
        free(__ptr);
      }
      singlylinkedlist_remove(handle->data_list,item_handle);
    }
  }
  return;
}

Assistant:

void uhttp_client_dowork(HTTP_CLIENT_HANDLE handle)
{
    if (handle != NULL)
    {
        /* Codes_SRS_UHTTP_07_037: [http_client_dowork shall call the underlying xio_dowork function. ] */
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;
        xio_dowork(http_data->xio_handle);

        // Wait till I'm connected
        if (handle->connected == 1)
        {
            LIST_ITEM_HANDLE pending_list_item;
            /* Codes_SRS_UHTTP_07_016: [http_client_dowork shall iterate through the queued Data using the xio interface to send the http request in the following ways...] */
            while ((pending_list_item = singlylinkedlist_get_head_item(http_data->data_list)) != NULL)
            {
                HTTP_SEND_DATA* send_data = (HTTP_SEND_DATA*)singlylinkedlist_item_get_value(pending_list_item);
                if (send_data != NULL)
                {
                    size_t content_len = BUFFER_length(send_data->content);
                    /* Codes_SRS_UHTTP_07_052: [uhttp_client_dowork shall call xio_send to transmits the header information... ] */
                    if (send_http_data(http_data, send_data->request_type, STRING_c_str(send_data->relative_path), send_data->header_line) != 0)
                    {
                        LogError("Failure writing content buffer");
                        if (http_data->on_error)
                        {
                            http_data->on_error(http_data->error_user_ctx, HTTP_CALLBACK_REASON_SEND_FAILED);
                        }
                    }
                    else if (content_len > 0)
                    {
                        /* Codes_SRS_UHTTP_07_053: [ Then uhttp_client_dowork shall use xio_send to transmit the content of the http request. ] */
                        if (write_data_line(http_data, BUFFER_u_char(send_data->content), content_len) != 0)
                        {
                            LogError("Failure writing content buffer");
                            if (http_data->on_error)
                            {
                                http_data->on_error(http_data->error_user_ctx, HTTP_CALLBACK_REASON_SEND_FAILED);
                            }
                        }
                    }

                    /* Codes_SRS_UHTTP_07_046: [ http_client_dowork shall free resouces queued to send to the http endpoint. ] */
                    STRING_delete(send_data->relative_path);
                    BUFFER_delete(send_data->content);
                    STRING_delete(send_data->header_line);
                    free(send_data);
                }
                (void)singlylinkedlist_remove(http_data->data_list, pending_list_item);
            }
        }
    }
}